

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O2

void test_cpp_add_many_64(void **param_1)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  pointer puVar4;
  pointer puVar5;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_long> __l_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  Roaring64Map r2;
  Roaring64Map r1;
  
  r1.roarings._M_t._M_impl._0_8_ = 0x7b0000270f;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0xfffffff7;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x270f00000000;
  __l._M_len = 6;
  __l._M_array = (iterator)&r1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&values,__l,
             (allocator_type *)&r2);
  p_Var1 = &r1.roarings._M_t._M_impl.super__Rb_tree_header;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  r1.roarings._M_t._M_impl._0_8_ = 0;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  r1.copyOnWrite = false;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  roaring::Roaring64Map::addMany
            (&r1,(long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2,
             (uint32_t *)
             values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start);
  puVar5 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  p_Var2 = &r2.roarings._M_t._M_impl.super__Rb_tree_header;
  r2.roarings._M_t._M_impl._0_8_ = 0;
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  r2.copyOnWrite = false;
  puVar4 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  for (; puVar4 != puVar5; puVar4 = (pointer)((long)puVar4 + 4)) {
    roaring::Roaring64Map::add(&r2,(uint32_t)*puVar4);
  }
  bVar3 = roaring::Roaring64Map::operator==(&r1,&r2);
  _assert_true((ulong)bVar3,"r1 == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x3e3);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&r2);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&r1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&values);
  r1.roarings._M_t._M_impl._0_8_ = 0x22b0000270f;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0x7b;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 1;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x1ffffffff;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x22bfffffff7;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0x22b0000270f;
  __l_00._M_len = 6;
  __l_00._M_array = (iterator)&r1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&values,__l_00,(allocator_type *)&r2);
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  r1.roarings._M_t._M_impl._0_8_ = 0;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  r1.copyOnWrite = false;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  roaring::Roaring64Map::addMany
            (&r1,(long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3,
             values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start);
  r2.roarings._M_t._M_impl._0_8_ = 0;
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  r2.copyOnWrite = false;
  puVar5 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  for (; puVar5 != values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish; puVar5 = puVar5 + 1) {
    roaring::Roaring64Map::add(&r2,*puVar5);
  }
  bVar3 = roaring::Roaring64Map::operator==(&r1,&r2);
  _assert_true((ulong)bVar3,"r1 == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x3f2);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&r2);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&r1);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

DEFINE_TEST(test_cpp_add_many_64) {
    {
        // 32-bit integers
        std::vector<uint32_t> values = {9999,       123, 0xFFFFFFFF,
                                        0xFFFFFFF7, 0,   9999};
        Roaring64Map r1;
        r1.addMany(values.size(), values.data());
        Roaring64Map r2;
        for (const auto value : values) {
            r2.add(value);
        }
        assert_true(r1 == r2);
    }

    auto b1 = uint64_t(1) << 32;
    auto b555 = uint64_t(555) << 32;

    std::vector<uint64_t> values = {
        b555 + 9999,       b1 + 123, b1 + 0xFFFFFFFF,
        b555 + 0xFFFFFFF7, 0,        b555 + 9999};
    Roaring64Map r1;
    r1.addMany(values.size(), values.data());
    Roaring64Map r2;
    for (const auto value : values) {
        r2.add(value);
    }
    assert_true(r1 == r2);
}